

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> * __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::
ConvertToNonSharedSimpleDictionaryType
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance)

{
  ScriptContext *pSVar1;
  SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *local_30;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *newTypeHandler;
  DynamicObject *instance_local;
  SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this_local;
  
  if (((byte)this->field_0x28 >> 1 & 1) == 0) {
    local_30 = (SimpleDictionaryUnorderedTypeHandler<int,_Js::JavascriptString_*,_false> *)
               SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
               ConvertToTypeHandler<Js::SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>,Js::JavascriptString*>
                         ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                          instance);
  }
  else {
    local_30 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
               ConvertToSimpleDictionaryUnorderedTypeHandler<int,Js::JavascriptString*,false>
                         ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                          instance);
  }
  pSVar1 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar1->convertSimpleSharedDictionaryToNonSharedCount =
       pSVar1->convertSimpleSharedDictionaryToNonSharedCount + 1;
  return &local_30->super_SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>;
}

Assistant:

SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>* SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToNonSharedSimpleDictionaryType(DynamicObject* instance)
    {
        // Although an unordered type handler is never actually shared, it can be flagged as shared by type snapshot enumeration
        // to freeze the initial type handler before enumeration commences
        SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>* newTypeHandler =
            isUnordered
                ? ConvertToSimpleDictionaryUnorderedTypeHandler<TPropertyIndex, TMapKey, IsNotExtensibleSupported>(instance)
                : ConvertToTypeHandler<SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>, TMapKey>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertSimpleSharedDictionaryToNonSharedCount++;
#endif
        return newTypeHandler;
    }